

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O3

bool __thiscall
soplex::SPxFastRT<double>::maxReEnter
          (SPxFastRT<double> *this,double *sel,double maxabs,SPxId *id,int nr,bool polish)

{
  Representation RVar1;
  int iVar2;
  SPxSolverBase<double> *pSVar3;
  UpdateVector<double> *pUVar4;
  UpdateVector<double> *pUVar5;
  Item *pIVar6;
  pointer pdVar7;
  pointer pdVar8;
  VectorBase<double> *pVVar9;
  int iVar10;
  uint uVar11;
  VectorBase<double> *pVVar12;
  Nonzero<double> *pNVar13;
  VectorBase<double> *pVVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  pSVar3 = (this->super_SPxRatioTester<double>).thesolver;
  pUVar4 = pSVar3->thePvec;
  pUVar5 = pSVar3->theCoPvec;
  RVar1 = pSVar3->theRep;
  iVar10 = (id->super_DataKey).info * RVar1;
  if (iVar10 < 0) {
    if (0 < RVar1 * ((pSVar3->super_SPxBasisBase<double>).thedesc.costat)->data[nr]) {
      SSVectorBase<double>::clearIdx(&pUVar5->thedelta,nr);
      return true;
    }
    pVVar14 = pSVar3->theCoUbound;
    pVVar12 = pSVar3->theCoLbound;
    dVar16 = (pUVar5->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[nr];
    dVar15 = (pUVar5->thedelta).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[nr];
  }
  else {
    if (iVar10 == 0) {
      return true;
    }
    pIVar6 = (pSVar3->thevectors->set).theitem;
    iVar10 = (pSVar3->thevectors->set).thekey[nr].idx;
    iVar2 = pIVar6[iVar10].data.super_SVectorBase<double>.memused;
    if (iVar2 < 1) {
      dVar16 = 0.0;
    }
    else {
      pNVar13 = pIVar6[iVar10].data.super_SVectorBase<double>.m_elem;
      uVar11 = iVar2 + 1;
      dVar17 = 0.0;
      dVar15 = 0.0;
      do {
        dVar18 = pNVar13->val *
                 (pUVar5->super_VectorBase<double>).val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[pNVar13->idx];
        dVar16 = dVar15 + dVar18;
        dVar17 = dVar17 + (dVar18 - (dVar16 - dVar15)) + (dVar15 - (dVar16 - (dVar16 - dVar15)));
        pNVar13 = pNVar13 + 1;
        uVar11 = uVar11 - 1;
        dVar15 = dVar16;
      } while (1 < uVar11);
      dVar16 = dVar16 + dVar17;
    }
    pVVar14 = pSVar3->theUbound;
    pVVar12 = pSVar3->theLbound;
    (pUVar4->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_start[nr] = dVar16;
    if (0 < RVar1 * ((pSVar3->super_SPxBasisBase<double>).thedesc.stat)->data[nr]) {
      SSVectorBase<double>::clearIdx(&pUVar4->thedelta,nr);
      return true;
    }
    dVar15 = (pUVar4->thedelta).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[nr];
  }
  pVVar9 = pVVar14;
  if (dVar15 < 0.0) {
    pVVar9 = pVVar12;
  }
  dVar17 = ((pVVar9->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[nr] - dVar16) / dVar15;
  *sel = dVar17;
  pdVar7 = (pVVar14->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (pVVar12->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pdVar7[nr] != pdVar8[nr]) || (NAN(pdVar7[nr]) || NAN(pdVar8[nr]))) {
    if ((dVar17 < -this->fastDelta / maxabs) && (*sel = 0.0, !polish)) {
      if (dVar15 <= 0.0) {
        pSVar3->theShift = pSVar3->theShift + pdVar8[nr];
        pdVar8[nr] = dVar16;
        pSVar3->theShift = pSVar3->theShift - dVar16;
      }
      else {
        pSVar3->theShift = pSVar3->theShift - pdVar7[nr];
        pdVar7[nr] = dVar16;
        pSVar3->theShift = dVar16 + pSVar3->theShift;
      }
    }
  }
  else {
    *sel = 0.0;
    if (!polish) {
      if (dVar16 <= pdVar7[nr]) {
        pSVar3->theShift = (pdVar8[nr] - dVar16) + pSVar3->theShift;
      }
      else {
        pSVar3->theShift = (dVar16 - pdVar7[nr]) + pSVar3->theShift;
      }
      pdVar8[nr] = dVar16;
      pdVar7[nr] = dVar16;
    }
  }
  return false;
}

Assistant:

bool SPxFastRT<R>::maxReEnter(R& sel,
                              R maxabs,
                              const SPxId& id,
                              int nr,
                              bool polish)
{
   R x, d;
   VectorBase<R>* up;
   VectorBase<R>* low;

   UpdateVector<R>& pvec = this->thesolver->pVec();
   SSVectorBase<R>& pupd = this->thesolver->pVec().delta();
   VectorBase<R>& upb = this->thesolver->upBound();
   VectorBase<R>& lpb = this->thesolver->lpBound();
   UpdateVector<R>& cvec = this->thesolver->coPvec();
   SSVectorBase<R>& cupd = this->thesolver->coPvec().delta();
   VectorBase<R>& ucb = this->thesolver->ucBound();
   VectorBase<R>& lcb = this->thesolver->lcBound();

   if(this->thesolver->isCoId(id))
   {
      if(this->thesolver->isCoBasic(nr))
      {
         cupd.clearIdx(nr);
         return true;
      }

      x = cvec[nr];
      d = cupd[nr];
      up = &ucb;
      low = &lcb;

      if(d < 0.0)
         sel = (lcb[nr] - cvec[nr]) / d;
      else
         sel = (ucb[nr] - cvec[nr]) / d;
   }
   else if(this->thesolver->isId(id))
   {
      pvec[nr] = this->thesolver->vector(nr) * cvec;

      if(this->thesolver->isBasic(nr))
      {
         pupd.clearIdx(nr);
         return true;
      }

      x = pvec[nr];
      d = pupd[nr];
      up = &upb;
      low = &lpb;

      if(d < 0.0)
         sel = (lpb[nr] - pvec[nr]) / d;
      else
         sel = (upb[nr] - pvec[nr]) / d;
   }
   else
      return true;

   if((*up)[nr] != (*low)[nr])
   {
      if(sel < -fastDelta / maxabs)
      {
         sel = 0.0;

         // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
         if(!polish)
         {
            if(d > 0.0)
            {
               this->thesolver->theShift -= (*up)[nr];
               (*up)[nr] = x;
               this->thesolver->theShift += (*up)[nr];
            }
            else
            {
               this->thesolver->theShift += (*low)[nr];
               (*low)[nr] = x;
               this->thesolver->theShift -= (*low)[nr];
            }
         }
      }
   }
   else
   {
      sel = 0.0;

      // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
      if(!polish)
      {
         if(x > (*up)[nr])
            this->thesolver->theShift += x - (*up)[nr];
         else
            this->thesolver->theShift += (*low)[nr] - x;

         (*up)[nr] = (*low)[nr] = x;
      }
   }

   return false;
}